

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseQuotedText(WastParser *this,string *text)

{
  size_type *psVar1;
  byte c;
  bool bVar2;
  TokenType TVar3;
  Result RVar4;
  byte bVar5;
  char *pcVar6;
  char *pcVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 auStack_a0 [8];
  Token token;
  size_type local_48;
  uint32_t local_38;
  uint32_t local_34 [2];
  uint32_t hi;
  
  TVar3 = Peek(this,0);
  if (TVar3 == Text) {
    Consume((Token *)auStack_a0,this);
    if (4 < token.loc.field_1.field_0.last_column - 0x5dU) {
      __assert_fail("HasText()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/token.h"
                    ,0x61,"const std::string &wabt::Token::text() const");
    }
    local_48 = (size_type)token.field_2.text_._M_dataplus._M_p;
    token.field_2._32_8_ = token._32_8_;
    if (&DAT_00000002 < (ulong)token.field_2.text_._M_dataplus._M_p) {
      join_0x00000010_0x00000000_ =
           string_view::substr((string_view *)((long)&token.field_2.literal_.text.field_2 + 8),1,
                               (long)token.field_2.text_._M_dataplus._M_p - 2);
      pcVar7 = token.field_2._32_8_;
      pcVar6 = pcVar7 + token._80_8_;
      if (pcVar7 < pcVar6) {
        do {
          if (*pcVar7 == '\\') {
            c = pcVar7[1];
            if (c < 0x6e) {
              bVar5 = c;
              if (((c != 0x22) && (c != 0x27)) && (c != 0x5c)) {
LAB_00f59426:
                RVar4 = ParseHexdigit(c,local_34);
                if ((RVar4.enum_ != Ok) ||
                   (RVar4 = ParseHexdigit(pcVar7[2],&local_38), RVar4.enum_ != Ok)) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wast-parser.cc"
                                ,0x55,
                                "void wabt::(anonymous namespace)::RemoveEscapes(string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::basic_string<char>>]"
                               );
                }
                std::__cxx11::string::push_back
                          ((string *)text,(byte)(local_34[0] << 4) | (byte)local_38);
                pcVar7 = pcVar7 + 2;
                goto LAB_00f5947d;
              }
            }
            else if (c == 0x74) {
              bVar5 = 9;
            }
            else if (c == 0x72) {
              bVar5 = 0xd;
            }
            else {
              bVar5 = 10;
              if (c != 0x6e) goto LAB_00f59426;
            }
            std::__cxx11::string::push_back((string *)text,bVar5);
            pcVar7 = pcVar7 + 1;
          }
          else {
            std::__cxx11::string::push_back((string *)text,*pcVar7);
          }
LAB_00f5947d:
          pcVar7 = pcVar7 + 1;
        } while (pcVar7 < pcVar6);
      }
    }
    bVar2 = IsValidUtf8((text->_M_dataplus)._M_p,text->_M_string_length);
    if (!bVar2) {
      Error(this,0x11d8afa);
    }
    Token::~Token((Token *)auStack_a0);
    RVar4.enum_ = Ok;
  }
  else {
    psVar1 = &token.loc.filename.size_;
    auStack_a0 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_a0,"a quoted string","");
    __l._M_len = 1;
    __l._M_array = (iterator)auStack_a0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&token.field_2.literal_.text.field_2 + 8),__l,(allocator_type *)local_34);
    RVar4 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)((long)&token.field_2.literal_.text.field_2 + 8),"\"foo\"");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&token.field_2.literal_.text.field_2 + 8));
    if (auStack_a0 != (undefined1  [8])psVar1) {
      operator_delete((void *)auStack_a0);
    }
  }
  return (Result)RVar4.enum_;
}

Assistant:

Result WastParser::ParseQuotedText(std::string* text) {
  WABT_TRACE(ParseQuotedText);
  if (!PeekMatch(TokenType::Text)) {
    return ErrorExpected({"a quoted string"}, "\"foo\"");
  }

  Token token = Consume();
  RemoveEscapes(token.text(), std::back_inserter(*text));
  if (!IsValidUtf8(text->data(), text->length())) {
    Error(token.loc, "quoted string has an invalid utf-8 encoding");
  }
  return Result::Ok;
}